

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::ParseProtoFields
          (Parser *this,StructDef *struct_def,bool isextend,bool inside_oneof)

{
  size_type *input;
  byte bVar1;
  size_type sVar2;
  FieldDef *__rhs;
  StructDef *pSVar3;
  iterator iVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  BaseType BVar8;
  BaseType BVar9;
  undefined4 uVar10;
  string *psVar11;
  int iVar12;
  undefined8 *puVar13;
  const_iterator cVar14;
  Value *e;
  Parser *pPVar15;
  EnumVal *pEVar16;
  long *plVar17;
  ulong *puVar18;
  ulong uVar19;
  undefined7 in_register_00000009;
  ulong *puVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong uVar22;
  undefined7 in_register_00000011;
  CheckedError *ce;
  char cVar23;
  Parser *pPVar24;
  ulong uVar25;
  int t;
  undefined4 in_R8D;
  undefined1 *puVar26;
  bool bVar27;
  pointer ppFVar28;
  bool bVar29;
  string val;
  FieldDef *field;
  string name;
  voffset_t attribute;
  EnumDef *oneof_union;
  StructDef *anonymous_struct;
  string proto_field_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_comment;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [24];
  undefined1 local_298 [32];
  undefined1 local_278 [16];
  undefined2 uStack_268;
  undefined6 uStack_266;
  undefined2 uStack_260;
  string *local_258;
  EnumDef *local_250;
  _Base_ptr local_248;
  undefined4 local_240;
  undefined4 local_23c;
  undefined1 local_238 [32];
  pointer local_218;
  pointer local_210;
  undefined1 local_208 [32];
  _Base_ptr local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 local_1d0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  pointer local_190;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_188;
  pointer local_180;
  _Rb_tree_node_base local_170;
  size_t local_150;
  pointer ppSStack_148;
  pointer local_140;
  pointer ppSStack_138;
  bool local_130;
  Namespace *local_128;
  uoffset_t local_120;
  undefined8 local_11c;
  string *local_110;
  undefined1 local_100 [24];
  _Base_ptr local_e8;
  size_t local_e0;
  pointer ppFStack_d8;
  pointer local_d0;
  pointer ppFStack_c8;
  bool local_c0;
  undefined2 local_bf;
  bool local_bd;
  size_t local_b8;
  uint8_t *local_b0;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_a8;
  pointer local_a0;
  pointer puStack_98;
  pointer local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  size_type *local_78;
  pointer *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_258 = (string *)CONCAT71(in_register_00000011,isextend);
  local_240 = (undefined4)CONCAT71(in_register_00000009,inside_oneof);
  t = (int)struct_def;
  local_23c = in_R8D;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_0011e261:
    return SUB82(this,0);
  }
  input = &(struct_def->super_Definition).file._M_string_length;
  local_70 = &(struct_def->super_Definition).doc_comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = &local_258[6]._M_string_length;
  local_80 = (_Base_ptr)&local_258[6].field_2;
  local_88 = (_Base_ptr)(local_1d0 + 0xd0);
  local_208._16_8_ = &local_258[9].field_2;
LAB_0011d0aa:
  do {
    puVar26 = local_298 + 0x10;
    iVar12 = *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc);
    if (iVar12 == 0x104) {
      iVar12 = std::__cxx11::string::compare((char *)input);
      if (iVar12 == 0) {
LAB_0011d2b3:
        ParseProtoDecl(this);
        goto LAB_0011d2be;
      }
      if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) {
        iVar12 = std::__cxx11::string::compare((char *)input);
        if (iVar12 == 0) goto LAB_0011d2b3;
        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104)
        goto LAB_0011d1ba;
        iVar12 = std::__cxx11::string::compare((char *)input);
        if (iVar12 == 0) goto LAB_0011d2b3;
        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104)
        goto LAB_0011d1ba;
        iVar12 = std::__cxx11::string::compare((char *)input);
        if (iVar12 == 0) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            Expect(this,t);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
            if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) {
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
              Next(this);
LAB_0011deb2:
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
            }
            Expect(this,t);
            goto LAB_0011d2be;
          }
          break;
        }
        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) {
          iVar12 = std::__cxx11::string::compare((char *)input);
          if (iVar12 == 0) {
            ParseProtoOption(this);
            goto LAB_0011deb2;
          }
          if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) {
            iVar12 = std::__cxx11::string::compare((char *)input);
            if (iVar12 == 0) {
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                bVar27 = false;
                uVar25 = 0;
                do {
                  iVar12 = *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc);
                  if (iVar12 == 0x102) {
                    local_278._0_8_ = local_278._0_8_ & 0xffffffffffff0000;
                    puVar20 = (ulong *)*input;
                    if (puVar20 == (ulong *)0x0) {
                      __assert_fail("s && val",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                                    ,0x14b,
                                    "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned short]"
                                   );
                    }
                    bVar1 = (byte)*puVar20;
                    puVar18 = puVar20;
                    while (bVar1 != 0) {
                      puVar18 = (ulong *)((long)puVar18 + 1);
                      if ((int)(char)bVar1 - 0x30U < 10) {
                        if ((bVar1 == 0x30) && ((*(byte *)puVar18 & 0xdf) == 0x58)) {
                          iVar12 = 0x10;
                          goto LAB_0011e0c6;
                        }
                        break;
                      }
                      bVar1 = *(byte *)puVar18;
                    }
                    iVar12 = 10;
LAB_0011e0c6:
                    local_1d0._0_8_ = puVar20;
                    uVar19 = strtoll_l((char *)puVar20,(char **)local_1d0,iVar12,
                                       ClassicLocale::instance_);
                    psVar11 = local_258;
                    if (((ulong *)local_1d0._0_8_ == puVar20) || (*(byte *)local_1d0._0_8_ != 0)) {
                      local_278._0_8_ = (ulong)(uint6)local_278._2_6_ << 0x10;
                    }
                    else {
                      uVar22 = 0xffff;
                      if (uVar19 < 0xffff) {
                        uVar22 = uVar19;
                      }
                      local_278._0_2_ = (undefined2)uVar22;
                      if (uVar19 < 0x10000) {
                        if (bVar27) {
                          iVar12 = (int)uVar25 + 1;
                          local_1d0._0_2_ = (ushort)iVar12;
                          if ((ushort)iVar12 <= (ushort)local_278._0_2_) {
                            do {
                              iVar4._M_current = *(unsigned_short **)((long)&psVar11[9].field_2 + 8)
                              ;
                              if (iVar4._M_current == (unsigned_short *)psVar11[10]._M_dataplus._M_p
                                 ) {
                                std::vector<unsigned_short,std::allocator<unsigned_short>>::
                                _M_realloc_insert<unsigned_short_const&>
                                          ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                                           local_208._16_8_,iVar4,(unsigned_short *)local_1d0);
                              }
                              else {
                                *iVar4._M_current = (unsigned_short)iVar12;
                                *(unsigned_short **)((long)&psVar11[9].field_2 + 8) =
                                     iVar4._M_current + 1;
                              }
                              iVar12 = (ushort)local_1d0._0_2_ + 1;
                              local_1d0._0_2_ = (ushort)iVar12;
                              uVar22 = local_278._0_8_ & 0xffff;
                            } while ((ushort)iVar12 <= (ushort)local_278._0_2_);
                          }
                          bVar27 = false;
                          uVar25 = uVar22 & 0xffffffff;
                        }
                        else {
                          iVar4._M_current = *(unsigned_short **)((long)&local_258[9].field_2 + 8);
                          if (iVar4._M_current == (unsigned_short *)local_258[10]._M_dataplus._M_p)
                          {
                            std::vector<unsigned_short,std::allocator<unsigned_short>>::
                            _M_realloc_insert<unsigned_short_const&>
                                      ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                                       local_208._16_8_,iVar4,(unsigned_short *)local_278);
                          }
                          else {
                            *iVar4._M_current = local_278._0_2_;
                            *(unsigned_short **)((long)&local_258[9].field_2 + 8) =
                                 iVar4._M_current + 1;
                          }
                          uVar25 = local_278._0_8_ & 0xffff;
                          bVar27 = false;
                        }
                        goto LAB_0011e1b9;
                      }
                    }
                    local_1d0._0_8_ = local_1d0 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1d0,
                               "Protobuf has non positive number in reserved ids","");
                    Error(this,(string *)struct_def);
                    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                    }
                    break;
                  }
                  if (iVar12 == 0x3b) goto LAB_0011e204;
LAB_0011e1b9:
                  iVar12 = std::__cxx11::string::compare((char *)input);
                  bVar27 = (bool)(bVar27 | iVar12 == 0);
                  Next(this);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
                } while( true );
              }
              break;
            }
            if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
               (iVar12 = std::__cxx11::string::compare((char *)input), iVar12 == 0)) {
              ParseProtoMapField(this,struct_def);
              goto LAB_0011d2be;
            }
          }
        }
      }
    }
    else if (iVar12 == 0x7d) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      }
      break;
    }
LAB_0011d1ba:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70);
    bVar27 = false;
    if (((char)local_23c != '\0') ||
       (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104)) {
      bVar7 = true;
      bVar6 = false;
      goto LAB_0011d2f4;
    }
    iVar12 = std::__cxx11::string::compare((char *)input);
    if (iVar12 != 0) {
      if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104)
      goto LAB_0011d2e8;
      iVar12 = std::__cxx11::string::compare((char *)input);
      if (iVar12 == 0) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011e254;
        bVar7 = false;
        goto LAB_0011d2ee;
      }
      if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104)
      goto LAB_0011d2e8;
      iVar12 = std::__cxx11::string::compare((char *)input);
      if (iVar12 == 0) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011e254;
        bVar7 = true;
        bVar6 = false;
        bVar27 = true;
        goto LAB_0011d2f4;
      }
      if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104) ||
         (iVar12 = std::__cxx11::string::compare((char *)input), iVar12 != 0)) goto LAB_0011d2e8;
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        bVar7 = true;
        bVar27 = false;
        bVar6 = true;
        goto LAB_0011d2f4;
      }
LAB_0011e254:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      break;
    }
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011e254;
LAB_0011d2e8:
    bVar7 = true;
LAB_0011d2ee:
    bVar27 = false;
    bVar6 = false;
LAB_0011d2f4:
    bVar29 = false;
    local_248 = (_Base_ptr)0x0;
    local_250 = (EnumDef *)0x0;
    uStack_268 = 0;
    uStack_266 = 0;
    uStack_260 = 0;
    local_278._0_8_ = (FieldDef *)0x0;
    local_278._8_2_ = 0;
    local_278._10_6_ = 0;
    if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) {
      iVar12 = std::__cxx11::string::compare((char *)input);
      bVar29 = iVar12 == 0;
    }
    if ((bool)(bVar29 | bVar6)) {
      if (bVar6) {
        if (*(char *)((long)&struct_def[3].super_Definition.file._M_dataplus._M_p + 2) != '\x01')
        goto LAB_0011d3ec;
        ConvertCase((string *)local_298,(string *)input,kUpperCamel,kSnake);
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)local_298);
        local_1d0._0_8_ = local_1d0 + 0x10;
        puVar20 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar20) {
          local_1d0._16_8_ = *puVar20;
          local_1d0._24_8_ = puVar13[3];
        }
        else {
          local_1d0._16_8_ = *puVar20;
          local_1d0._0_8_ = (ulong *)*puVar13;
        }
        local_1d0._8_8_ = puVar13[1];
        *puVar13 = puVar20;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        if ((undefined1 *)local_298._0_8_ != puVar26) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        StartEnum(this,(string *)struct_def,SUB81(local_1d0,0),(EnumDef **)0x1);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011e22f;
        local_278._0_8_ = (FieldDef *)0x10;
        local_278._8_2_ = 0;
        local_278._10_6_ = 0;
        uStack_268 = SUB82(local_250,0);
        uStack_266 = (undefined6)((ulong)local_250 >> 0x10);
      }
      else {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011e254;
LAB_0011d3ec:
        iVar12 = *(int *)&struct_def[5].fixed;
        *(int *)&struct_def[5].fixed = iVar12 + 1;
        NumToString<int>((string *)local_298,iVar12);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0,"Anonymous",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298);
        if ((undefined1 *)local_298._0_8_ != puVar26) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        StartStruct(this,(string *)struct_def,(StructDef **)local_1d0);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_0011e22f:
          if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
            operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
          }
          goto LAB_0011e254;
        }
        local_278._0_8_ = (FieldDef *)0xf;
        local_278._8_2_ = SUB82(local_248,0);
        local_278._10_6_ = (undefined6)((ulong)local_248 >> 0x10);
        uStack_268 = 0;
        uStack_266 = 0;
      }
      uStack_260 = 0;
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
    }
    else {
      ParseTypeFromProtoType(this,(Type *)struct_def);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011e254;
    }
    if (bVar27) {
      uVar10 = local_278._0_4_;
      local_278._4_4_ = local_278._0_4_;
      local_278._0_4_ = 0xe;
      if (uVar10 == 0xe) {
        local_278._0_8_ = (FieldDef *)0xd0000000e;
      }
    }
    sVar2 = (struct_def->super_Definition).file._M_string_length;
    local_298._0_8_ = puVar26;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,sVar2,
               (struct_def->super_Definition).file.field_2._M_allocated_capacity + sVar2);
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      local_218 = (pointer)local_208;
      local_210 = (pointer)0x0;
      local_208[0] = 0;
      if (bVar6) {
LAB_0011d5d7:
        local_2b0._16_8_ = 0;
        if ((char)local_240 == '\0') {
LAB_0011d676:
          AddField(this,struct_def,local_258,(Type *)local_298,(FieldDef **)local_278);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0011d6a8;
        }
        else {
          cVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                           *)local_78,(key_type *)local_298);
          if (cVar14._M_node == local_80) {
            local_2b0._16_8_ = 0;
            goto LAB_0011d676;
          }
          local_2b0._16_8_ = *(undefined8 *)(cVar14._M_node + 2);
          if (local_2b0._16_8_ == 0) goto LAB_0011d676;
LAB_0011d6a8:
          uVar5 = local_2b0._16_8_;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_2b0._16_8_ + 0x40),&local_68);
          if (!(bool)(~bVar6 & local_210 == (pointer)0x0)) {
            e = (Value *)operator_new(0x48);
            *(undefined8 *)((long)&(e->type).struct_def + 2) = 0;
            *(undefined8 *)((long)&(e->type).enum_def + 2) = 0;
            (e->type).base_type = BASE_TYPE_NONE;
            (e->type).element = BASE_TYPE_NONE;
            (e->type).struct_def = (StructDef *)0x0;
            (e->constant)._M_dataplus._M_p = (pointer)&(e->constant).field_2;
            *(undefined2 *)&(e->constant).field_2 = 0x30;
            (e->constant)._M_string_length = 1;
            e->offset = 0xffff;
            std::__cxx11::string::_M_assign((string *)&e->constant);
            local_1d0._0_8_ = local_1d0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"id","");
            SymbolTable<flatbuffers::Value>::Add
                      ((SymbolTable<flatbuffers::Value> *)(uVar5 + 0x58),(string *)local_1d0,e);
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
            }
          }
          if (!bVar7 && 0xb < local_278._0_4_ - 1) {
            *(undefined4 *)(uVar5 + 0x118) = 0;
          }
          if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x5b) {
LAB_0011da84:
            if (local_248 == (_Base_ptr)0x0) {
              if (local_250 == (EnumDef *)0x0) {
                Expect(this,t);
LAB_0011dc73:
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011dc85;
              }
              else {
                local_1d0._0_8_ = local_1d0 + 0x10;
                local_1d0._8_8_ = (_Base_ptr)0x0;
                local_1d0._16_8_ = local_1d0._16_8_ & 0xffffffffffffff00;
                local_1d0._32_8_ = local_1d0 + 0x30;
                local_1d0._40_8_ = (_Base_ptr)0x0;
                local_1a0._M_local_buf[0] = false;
                local_180 = (pointer)0x0;
                local_190 = (pointer)0x0;
                _Stack_188._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                local_170._M_color = _S_red;
                local_170._M_parent = (_Base_ptr)0x0;
                local_170._M_left = (_Base_ptr)(local_1d0 + 0x60);
                local_128 = (Namespace *)0x0;
                local_120 = 0;
                local_130 = false;
                local_140 = (pointer)0x0;
                ppSStack_138 = (pointer)0x0;
                local_150 = 0;
                ppSStack_148 = (pointer)0x0;
                local_11c._0_4_ = -1;
                local_11c._4_4_ = 1;
                local_110 = (string *)0x0;
                local_100._0_4_ = _S_red;
                local_100._8_8_ = (_Base_ptr)0x0;
                local_100._16_8_ = local_88;
                local_e8 = local_88;
                local_c0 = false;
                local_d0 = (pointer)0x0;
                ppFStack_c8 = (pointer)0x0;
                local_e0 = 0;
                ppFStack_d8 = (pointer)0x0;
                local_bf._0_1_ = true;
                local_bf._1_1_ = true;
                local_bd = false;
                local_b8 = 1;
                local_90 = (pointer)0x0;
                local_a0 = (pointer)0x0;
                puStack_98 = (pointer)0x0;
                local_b0 = (uint8_t *)0x0;
                _Stack_a8._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                local_170._M_right = local_170._M_left;
                ParseProtoFields(this,struct_def,SUB81(local_1d0,0),false);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_0011dc0e:
                  StructDef::~StructDef((StructDef *)local_1d0);
                  goto LAB_0011dc85;
                }
                ppFVar28 = ppFStack_d8;
                if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x3b) {
                  Next(this);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  ppFVar28 = ppFStack_d8;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011dc0e;
                }
                for (; ppFVar28 != local_d0; ppFVar28 = ppFVar28 + 1) {
                  __rhs = *ppFVar28;
                  if ((((__rhs->value).type.base_type != BASE_TYPE_STRUCT) ||
                      (pSVar3 = (__rhs->value).type.struct_def, pSVar3 == (StructDef *)0x0)) ||
                     (pSVar3->fixed == true)) {
                    std::operator+(&local_50,"oneof \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_298);
                    plVar17 = (long *)std::__cxx11::string::append((char *)&local_50);
                    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(plVar17 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar17 == paVar21) {
                      local_1e0._M_allocated_capacity = paVar21->_M_allocated_capacity;
                      local_1e0._8_8_ = plVar17[3];
                      local_208._24_8_ = &local_1e0;
                    }
                    else {
                      local_1e0._M_allocated_capacity = paVar21->_M_allocated_capacity;
                      local_208._24_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*plVar17;
                    }
                    local_1e8 = (_Base_ptr)plVar17[1];
                    *plVar17 = (long)paVar21;
                    plVar17[1] = 0;
                    *(undefined1 *)(plVar17 + 2) = 0;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_238,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_208 + 0x18),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs);
                    plVar17 = (long *)std::__cxx11::string::append((char *)local_238);
                    local_2c0._0_8_ = local_2b0;
                    pPVar24 = (Parser *)(plVar17 + 2);
                    if ((Parser *)*plVar17 == pPVar24) {
                      local_2b0._0_8_ =
                           (((Definition *)&pPVar24->super_ParserState)->name)._M_dataplus._M_p;
                      local_2b0._8_8_ = plVar17[3];
                    }
                    else {
                      local_2b0._0_8_ =
                           (((Definition *)&pPVar24->super_ParserState)->name)._M_dataplus._M_p;
                      local_2c0._0_8_ = (Parser *)*plVar17;
                    }
                    local_2c0._8_8_ = plVar17[1];
                    *plVar17 = (long)pPVar24;
                    plVar17[1] = 0;
                    *(undefined1 *)(plVar17 + 2) = 0;
                    Error(this,(string *)struct_def);
                    if ((Parser *)local_2c0._0_8_ != (Parser *)local_2b0) {
                      operator_delete((void *)local_2c0._0_8_,(ulong)(local_2b0._0_8_ + 1));
                    }
                    if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)(local_238 + 0x10)) {
                      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208._24_8_ != &local_1e0) {
                      operator_delete((void *)local_208._24_8_,local_1e0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_0011dc0e;
                  }
                  local_2c0._8_8_ = local_250;
                  local_2b0._0_8_ = (pointer)0x0;
                  local_2b0._8_8_ = local_2b0._8_8_ & 0xffffffffffffff00;
                  local_2c0._0_8_ = struct_def;
                  pEVar16 = EnumValBuilder::CreateEnumerator
                                      ((EnumValBuilder *)local_2c0,(string *)pSVar3);
                  BVar8 = (__rhs->value).type.base_type;
                  BVar9 = (__rhs->value).type.element;
                  pSVar3 = (__rhs->value).type.struct_def;
                  uVar5 = *(undefined8 *)((long)&(__rhs->value).type.enum_def + 2);
                  *(undefined8 *)((long)&(pEVar16->union_type).struct_def + 2) =
                       *(undefined8 *)((long)&(__rhs->value).type.struct_def + 2);
                  *(undefined8 *)((long)&(pEVar16->union_type).enum_def + 2) = uVar5;
                  (pEVar16->union_type).base_type = BVar8;
                  (pEVar16->union_type).element = BVar9;
                  (pEVar16->union_type).struct_def = pSVar3;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=(&pEVar16->doc_comment,&(__rhs->super_Definition).doc_comment);
                  EnumValBuilder::AcceptEnumerator((EnumValBuilder *)this,(string *)local_2c0);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  cVar23 = *(char *)&(this->super_ParserState).prev_cursor_;
                  EnumValBuilder::~EnumValBuilder((EnumValBuilder *)local_2c0);
                  if (cVar23 != '\0') goto LAB_0011dc0e;
                }
                StructDef::~StructDef((StructDef *)local_1d0);
              }
            }
            else {
              ParseProtoFields(this,struct_def,SUB81(local_248,0),false);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011daaf;
              if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x3b) {
                Next(this);
                goto LAB_0011dc73;
              }
            }
            bVar27 = true;
            goto LAB_0011dc87;
          }
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            do {
              sVar2 = (struct_def->super_Definition).file._M_string_length;
              local_1d0._0_8_ = local_1d0 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1d0,sVar2,
                         (struct_def->super_Definition).file.field_2._M_allocated_capacity + sVar2);
              ParseProtoKey(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              cVar23 = '\x01';
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                Expect(this,t);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  local_2c0._0_8_ = local_2b0;
                  sVar2 = (struct_def->super_Definition).file._M_string_length;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_2c0,sVar2,
                             (struct_def->super_Definition).file.field_2._M_allocated_capacity +
                             sVar2);
                  ParseProtoCurliesOrIdent(this);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  cVar23 = '\x01';
                  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                    iVar12 = std::__cxx11::string::compare(local_1d0);
                    pPVar24 = (Parser *)local_2c0._0_8_;
                    if (iVar12 == 0) {
                      pPVar15 = (Parser *)strpbrk((char *)local_2c0._0_8_,"0123456789-+.");
                      if (local_278._0_4_ - 0xb < 2) {
                        iVar12 = std::__cxx11::string::compare(local_2c0);
                        if (((iVar12 == 0) ||
                            (iVar12 = std::__cxx11::string::compare(local_2c0), iVar12 == 0)) ||
                           (iVar12 = std::__cxx11::string::compare(local_2c0), iVar12 == 0)) {
                          iVar12 = std::__cxx11::string::compare(local_2c0);
                          local_238._0_8_ = local_238 + 0x10;
                          if (iVar12 == 0) {
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_238,"+inf","");
                          }
                          else {
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)local_238,local_2c0._0_8_,
                                       (char *)(local_2c0._0_8_ +
                                               (long)(Definition *)local_2c0._8_8_));
                          }
                          std::__cxx11::string::operator=
                                    ((string *)(local_2b0._16_8_ + 0xe8),(string *)local_238);
                          if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)(local_238 + 0x10)) {
                            operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
                          }
                          goto LAB_0011da02;
                        }
                        pPVar24 = (Parser *)local_2c0._0_8_;
                      }
                      if (((local_278._0_4_ - 1 < 0xc) && (pPVar15 == pPVar24)) ||
                         (iVar12 = std::__cxx11::string::compare(local_2c0), iVar12 == 0)) {
                        std::__cxx11::string::_M_assign((string *)(local_2b0._16_8_ + 0xe8));
                      }
                    }
                    else {
                      iVar12 = std::__cxx11::string::compare(local_1d0);
                      if (iVar12 == 0) {
                        iVar12 = std::__cxx11::string::compare(local_2c0);
                        *(bool *)(local_2b0._16_8_ + 0x110) = iVar12 == 0;
                      }
                    }
LAB_0011da02:
                    cVar23 = '\t';
                    if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x2c)
                    {
                      Next(this);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      cVar23 = *(char *)&(this->super_ParserState).prev_cursor_;
                    }
                  }
                  if ((Parser *)local_2c0._0_8_ != (Parser *)local_2b0) {
                    operator_delete((void *)local_2c0._0_8_,(ulong)(local_2b0._0_8_ + 1));
                  }
                }
              }
              if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
              }
            } while (cVar23 == '\0');
            if (cVar23 == '\t') {
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0011da84;
            }
          }
        }
LAB_0011daaf:
        bVar27 = false;
      }
      else {
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          std::__cxx11::string::_M_assign((string *)&local_218);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0011d5d7;
        }
LAB_0011dc85:
        bVar27 = false;
      }
LAB_0011dc87:
      if (local_218 != (pointer)local_208) {
        operator_delete(local_218,CONCAT71(local_208._1_7_,local_208[0]) + 1);
      }
    }
    else {
      bVar27 = false;
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  } while (bVar27);
  goto LAB_0011e261;
LAB_0011e204:
  Next(this);
LAB_0011d2be:
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011e261;
  goto LAB_0011d0aa;
}

Assistant:

CheckedError Parser::ParseProtoFields(StructDef *struct_def, bool isextend,
                                      bool inside_oneof) {
  EXPECT('{');
  while (token_ != '}') {
    if (IsIdent("message") || IsIdent("extend") || IsIdent("enum")) {
      // Nested declarations.
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("extensions")) {  // Skip these.
      NEXT();
      EXPECT(kTokenIntegerConstant);
      if (Is(kTokenIdentifier)) {
        NEXT();  // to
        NEXT();  // num
      }
      EXPECT(';');
    } else if (IsIdent("option")) {  // Skip these.
      ECHECK(ParseProtoOption());
      EXPECT(';');
    } else if (IsIdent("reserved")) {  // Skip these.
      /**
       * Reserved proto ids can be comma seperated (e.g. 1,2,4,5;)
       * or range based (e.g. 9 to 11;)
       * or combination of them (e.g. 1,2,9 to 11,4,5;)
       * It will be ended by a semicolon.
       */
      NEXT();
      bool range = false;
      voffset_t from = 0;

      while (!Is(';')) {
        if (token_ == kTokenIntegerConstant) {
          voffset_t attribute = 0;
          bool done = StringToNumber(attribute_.c_str(), &attribute);
          if (!done)
            return Error("Protobuf has non positive number in reserved ids");

          if (range) {
            for (voffset_t id = from + 1; id <= attribute; id++)
              struct_def->reserved_ids.push_back(id);

            range = false;
          } else {
            struct_def->reserved_ids.push_back(attribute);
          }

          from = attribute;
        }

        if (attribute_ == "to") range = true;

        NEXT();
      }  // A variety of formats, just skip.

      NEXT();
    } else if (IsIdent("map")) {
      ECHECK(ParseProtoMapField(struct_def));
    } else {
      std::vector<std::string> field_comment = doc_comment_;
      // Parse the qualifier.
      bool required = false;
      bool repeated = false;
      bool oneof = false;
      if (!inside_oneof) {
        if (IsIdent("optional")) {
          // This is the default.
          NEXT();
        } else if (IsIdent("required")) {
          required = true;
          NEXT();
        } else if (IsIdent("repeated")) {
          repeated = true;
          NEXT();
        } else if (IsIdent("oneof")) {
          oneof = true;
          NEXT();
        } else {
          // can't error, proto3 allows decls without any of the above.
        }
      }
      StructDef *anonymous_struct = nullptr;
      EnumDef *oneof_union = nullptr;
      Type type;
      if (IsIdent("group") || oneof) {
        if (!oneof) NEXT();
        if (oneof && opts.proto_oneof_union) {
          auto name = ConvertCase(attribute_, Case::kUpperCamel) + "Union";
          ECHECK(StartEnum(name, true, &oneof_union));
          type = Type(BASE_TYPE_UNION, nullptr, oneof_union);
        } else {
          auto name = "Anonymous" + NumToString(anonymous_counter_++);
          ECHECK(StartStruct(name, &anonymous_struct));
          type = Type(BASE_TYPE_STRUCT, anonymous_struct);
        }
      } else {
        ECHECK(ParseTypeFromProtoType(&type));
      }
      // Repeated elements get mapped to a vector.
      if (repeated) {
        type.element = type.base_type;
        type.base_type = BASE_TYPE_VECTOR;
        if (type.element == BASE_TYPE_VECTOR) {
          // We have a vector or vectors, which FlatBuffers doesn't support.
          // For now make it a vector of string (since the source is likely
          // "repeated bytes").
          // TODO(wvo): A better solution would be to wrap this in a table.
          type.element = BASE_TYPE_STRING;
        }
      }
      std::string name = attribute_;
      EXPECT(kTokenIdentifier);
      std::string proto_field_id;
      if (!oneof) {
        // Parse the field id. Since we're just translating schemas, not
        // any kind of binary compatibility, we can safely ignore these, and
        // assign our own.
        EXPECT('=');
        proto_field_id = attribute_;
        EXPECT(kTokenIntegerConstant);
      }
      FieldDef *field = nullptr;
      if (isextend) {
        // We allow a field to be re-defined when extending.
        // TODO: are there situations where that is problematic?
        field = struct_def->fields.Lookup(name);
      }
      if (!field) ECHECK(AddField(*struct_def, name, type, &field));
      field->doc_comment = field_comment;
      if (!proto_field_id.empty() || oneof) {
        auto val = new Value();
        val->constant = proto_field_id;
        field->attributes.Add("id", val);
      }
      if (!IsScalar(type.base_type) && required) {
        field->presence = FieldDef::kRequired;
      }
      // See if there's a default specified.
      if (Is('[')) {
        NEXT();
        for (;;) {
          auto key = attribute_;
          ECHECK(ParseProtoKey());
          EXPECT('=');
          auto val = attribute_;
          ECHECK(ParseProtoCurliesOrIdent());
          if (key == "default") {
            // Temp: skip non-numeric and non-boolean defaults (enums).
            auto numeric = strpbrk(val.c_str(), "0123456789-+.");
            if (IsFloat(type.base_type) &&
                (val == "inf" || val == "+inf" || val == "-inf")) {
              // Prefer to be explicit with +inf.
              field->value.constant = val == "inf" ? "+inf" : val;
            } else if (IsScalar(type.base_type) && numeric == val.c_str()) {
              field->value.constant = val;
            } else if (val == "true") {
              field->value.constant = val;
            }  // "false" is default, no need to handle explicitly.
          } else if (key == "deprecated") {
            field->deprecated = val == "true";
          }
          if (!Is(',')) break;
          NEXT();
        }
        EXPECT(']');
      }
      if (anonymous_struct) {
        ECHECK(ParseProtoFields(anonymous_struct, false, oneof));
        if (Is(';')) NEXT();
      } else if (oneof_union) {
        // Parse into a temporary StructDef, then transfer fields into an
        // EnumDef describing the oneof as a union.
        StructDef oneof_struct;
        ECHECK(ParseProtoFields(&oneof_struct, false, oneof));
        if (Is(';')) NEXT();
        for (auto field_it = oneof_struct.fields.vec.begin();
             field_it != oneof_struct.fields.vec.end(); ++field_it) {
          const auto &oneof_field = **field_it;
          const auto &oneof_type = oneof_field.value.type;
          if (oneof_type.base_type != BASE_TYPE_STRUCT ||
              !oneof_type.struct_def || oneof_type.struct_def->fixed)
            return Error("oneof '" + name +
                         "' cannot be mapped to a union because member '" +
                         oneof_field.name + "' is not a table type.");
          EnumValBuilder evb(*this, *oneof_union);
          auto ev = evb.CreateEnumerator(oneof_type.struct_def->name);
          ev->union_type = oneof_type;
          ev->doc_comment = oneof_field.doc_comment;
          ECHECK(evb.AcceptEnumerator(oneof_field.name));
        }
      } else {
        EXPECT(';');
      }
    }
  }
  NEXT();
  return NoError();
}